

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall
llvm::detail::IEEEFloat::roundAwayFromZero
          (IEEEFloat *this,roundingMode rounding_mode,lostFraction lost_fraction,uint bit)

{
  bool bVar1;
  int iVar2;
  integerPart *parts;
  bool bVar3;
  bool local_39;
  uint bit_local;
  lostFraction lost_fraction_local;
  roundingMode rounding_mode_local;
  IEEEFloat *this_local;
  
  bVar1 = isFiniteNonZero(this);
  bVar3 = true;
  if (!bVar1) {
    bVar3 = (this->field_0x12 & 7) == 3;
  }
  if (!bVar3) {
    __assert_fail("isFiniteNonZero() || category == fcZero",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4da,
                  "bool llvm::detail::IEEEFloat::roundAwayFromZero(roundingMode, lostFraction, unsigned int) const"
                 );
  }
  if (lost_fraction == lfExactlyZero) {
    __assert_fail("lost_fraction != lfExactlyZero",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x4dd,
                  "bool llvm::detail::IEEEFloat::roundAwayFromZero(roundingMode, lostFraction, unsigned int) const"
                 );
  }
  switch(rounding_mode) {
  case rmNearestTiesToEven:
    if (lost_fraction == lfMoreThanHalf) {
      this_local._7_1_ = true;
    }
    else if ((lost_fraction == lfExactlyHalf) && ((this->field_0x12 & 7) != 3)) {
      parts = significandParts(this);
      iVar2 = APInt::tcExtractBit(parts,bit);
      this_local._7_1_ = iVar2 != 0;
    }
    else {
      this_local._7_1_ = false;
    }
    break;
  case rmTowardPositive:
    this_local._7_1_ = ((byte)this->field_0x12 >> 3 & 1) == 0;
    break;
  case rmTowardNegative:
    this_local._7_1_ = ((byte)this->field_0x12 >> 3 & 1) != 0;
    break;
  case rmTowardZero:
    this_local._7_1_ = false;
    break;
  case rmNearestTiesToAway:
    local_39 = lost_fraction == lfExactlyHalf || lost_fraction == lfMoreThanHalf;
    this_local._7_1_ = local_39;
    break;
  default:
    llvm_unreachable_internal
              ("Invalid rounding mode found",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
               ,0x4f6);
  }
  return this_local._7_1_;
}

Assistant:

bool IEEEFloat::roundAwayFromZero(roundingMode rounding_mode,
                                  lostFraction lost_fraction,
                                  unsigned int bit) const {
  /* NaNs and infinities should not have lost fractions.  */
  assert(isFiniteNonZero() || category == fcZero);

  /* Current callers never pass this so we don't handle it.  */
  assert(lost_fraction != lfExactlyZero);

  switch (rounding_mode) {
  case rmNearestTiesToAway:
    return lost_fraction == lfExactlyHalf || lost_fraction == lfMoreThanHalf;

  case rmNearestTiesToEven:
    if (lost_fraction == lfMoreThanHalf)
      return true;

    /* Our zeroes don't have a significand to test.  */
    if (lost_fraction == lfExactlyHalf && category != fcZero)
      return APInt::tcExtractBit(significandParts(), bit);

    return false;

  case rmTowardZero:
    return false;

  case rmTowardPositive:
    return !sign;

  case rmTowardNegative:
    return sign;
  }
  llvm_unreachable("Invalid rounding mode found");
}